

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::string,int,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,true>>
::lower_bound<std::__cxx11::string>
          (btree_node<phmap::priv::map_params<std::__cxx11::string,int,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,true>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
          key_compare *comp)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, int, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, int>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, int, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, int, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, int>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, int, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  uVar4 = (uint)(byte)this[10];
  if (this[10] ==
      (btree_node<phmap::priv::map_params<std::__cxx11::string,int,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,true>>
       )0x0) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar2 = (int)(uVar4 + uVar3) >> 1;
      iVar1 = std::__cxx11::string::compare((string *)(this + (long)(int)uVar2 * 0x28 + 0x10));
      if (iVar1 < 0) {
        uVar3 = uVar2 + 1;
        uVar2 = uVar4;
      }
      uVar4 = uVar2;
    } while (uVar3 != uVar4);
  }
  return (SearchResult<int,_false>)uVar4;
}

Assistant:

SearchResult<int, is_key_compare_to::value> lower_bound(
            const K &k, const key_compare &comp) const {
            return use_linear_search::value ? linear_search(k, comp)
                : binary_search(k, comp);
        }